

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall
Node::OutputVirtualList
          (Node *this,ostream *os,Node *Channel,Node *MainType,int ExtType,int GlobalStat)

{
  Node *pNVar1;
  ostream *poVar2;
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [64];
  undefined1 local_a8 [32];
  undefined1 local_88 [48];
  undefined1 local_58 [40];
  VariableStruct *ThisVar;
  int GlobalStat_local;
  int ExtType_local;
  Node *MainType_local;
  Node *Channel_local;
  ostream *os_local;
  Node *this_local;
  
  ThisVar._0_4_ = GlobalStat;
  ThisVar._4_4_ = ExtType;
  _GlobalStat_local = MainType;
  MainType_local = Channel;
  Channel_local = (Node *)os;
  os_local = (ostream *)this;
  if (this->Type == 0x1f5) {
    OutputVirtualList(this->Tree[0],os,Channel,MainType,ExtType,0);
    OutputVirtualList(this->Tree[1],(ostream *)Channel_local,MainType_local,_GlobalStat_local,
                      ThisVar._4_4_,0);
  }
  else {
    local_58._32_8_ = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
    pNVar1 = Channel_local;
    Indent_abi_cxx11_((Node *)local_58);
    poVar2 = std::operator<<((ostream *)pNVar1,(string *)local_58);
    poVar2 = std::operator<<(poVar2,"VirtualArray<");
    OutputNodeVarType_abi_cxx11_((Node *)local_88);
    poVar2 = std::operator<<(poVar2,(string *)local_88);
    std::operator<<(poVar2,"> ");
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_58);
    pNVar1 = Channel_local;
    if ((VariableStruct *)local_58._32_8_ == (VariableStruct *)0x0) {
      genname((string *)(local_e8 + 0x20));
      poVar2 = std::operator<<((ostream *)pNVar1,(string *)(local_e8 + 0x20));
      std::operator<<(poVar2,"(");
      std::__cxx11::string::~string((string *)(local_e8 + 0x20));
    }
    else {
      VariableStruct::GetName_abi_cxx11_((VariableStruct *)local_a8,(int)local_58._32_8_);
      poVar2 = std::operator<<((ostream *)pNVar1,(string *)local_a8);
      std::operator<<(poVar2,"(");
      std::__cxx11::string::~string((string *)local_a8);
    }
    pNVar1 = Channel_local;
    Expression_abi_cxx11_((Node *)local_e8);
    poVar2 = std::operator<<((ostream *)pNVar1,(string *)local_e8);
    poVar2 = std::operator<<(poVar2,", ");
    Expression_abi_cxx11_((Node *)local_108);
    std::operator<<(poVar2,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)local_e8);
    if (this->Tree[3] != (Node *)0x0) {
      poVar2 = std::operator<<((ostream *)Channel_local,", ");
      Expression_abi_cxx11_((Node *)local_128);
      std::operator<<(poVar2,(string *)local_128);
      std::__cxx11::string::~string((string *)local_128);
    }
    poVar2 = std::operator<<((ostream *)Channel_local,");");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (this->Block[0] != (Node *)0x0) {
      OutputVirtualList(this->Block[0],(ostream *)Channel_local,MainType_local,_GlobalStat_local,
                        ThisVar._4_4_,0);
    }
  }
  return;
}

Assistant:

void Node::OutputVirtualList(
	std::ostream& os,	/**< iostream to write C++ code */
	Node* Channel,		/**< IO channe to use */
	Node* MainType,		/**< Main stat type */
	int ExtType,		/**< Extra data type */
	int GlobalStat		/**< Global status */
)
{
	VariableStruct *ThisVar;

	switch(Type)
	{
	case BAS_N_LIST:

		//
		// Put multiple items on seperate lines
		//
		Tree[0]->OutputVirtualList(os, Channel, MainType, ExtType);
		Tree[1]->OutputVirtualList(os, Channel, MainType, ExtType);

		break;

	default:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);

		os << Indent() <<
			"VirtualArray<" <<
			Tree[1]->OutputNodeVarType() << "> ";

		if (ThisVar != 0)
		{
			os << ThisVar->GetName() << "(";
		}
		else
		{
			os << genname(Tree[0]->TextValue) << "(";
		}
		os << Channel->Expression() << ", " << Tree[2]->Expression();

		if (Tree[3] != 0)
		{
			os << ", " << Tree[3]->Expression();
		}
		os << ");" << std::endl;

		if (Block[0] != 0)
		{
			Block[0]->OutputVirtualList(os, Channel, MainType, ExtType);
		}
		break;

	}
}